

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int push_additional_extensions(ptls_handshake_properties_t *properties,ptls_buffer_t *sendbuf)

{
  ushort uVar1;
  uint8_t *puVar2;
  size_t delta;
  int in_EAX;
  ulong uVar3;
  long lVar4;
  int iVar5;
  ptls_raw_extension_t *ppVar6;
  size_t sVar7;
  bool bVar8;
  
  if ((properties != (ptls_handshake_properties_t *)0x0) &&
     (ppVar6 = properties->additional_extensions, ppVar6 != (ptls_raw_extension_t *)0x0)) {
    uVar1 = ppVar6->type;
    if (uVar1 == 0xffff) {
      bVar8 = true;
    }
    else {
      do {
        in_EAX = ptls_buffer_reserve(sendbuf,2);
        if (in_EAX == 0) {
          *(ushort *)(sendbuf->base + sendbuf->off) = uVar1 << 8 | uVar1 >> 8;
          sendbuf->off = sendbuf->off + 2;
          in_EAX = 0;
        }
        if (in_EAX != 0) {
          bVar8 = false;
          goto LAB_00112ea0;
        }
        in_EAX = ptls_buffer_reserve(sendbuf,2);
        if (in_EAX == 0) {
          puVar2 = sendbuf->base;
          sVar7 = sendbuf->off;
          (puVar2 + sVar7)[0] = '\0';
          (puVar2 + sVar7)[1] = '\0';
          sendbuf->off = sendbuf->off + 2;
          in_EAX = 0;
        }
        iVar5 = 0xb;
        if (in_EAX == 0) {
          sVar7 = sendbuf->off;
          delta = (ppVar6->data).len;
          in_EAX = 0;
          if (delta != 0) {
            puVar2 = (ppVar6->data).base;
            in_EAX = ptls_buffer_reserve(sendbuf,delta);
            if (in_EAX == 0) {
              memcpy(sendbuf->base + sendbuf->off,puVar2,delta);
              sendbuf->off = sendbuf->off + delta;
              in_EAX = 0;
            }
          }
          if (in_EAX == 0) {
            uVar3 = sendbuf->off - sVar7;
            lVar4 = 8;
            do {
              sendbuf->base[sVar7 - 2] = (uint8_t)(uVar3 >> ((byte)lVar4 & 0x3f));
              lVar4 = lVar4 + -8;
              sVar7 = sVar7 + 1;
            } while (lVar4 != -8);
            iVar5 = 0;
            bVar8 = true;
            in_EAX = 0;
          }
          else {
            bVar8 = false;
          }
        }
        else {
          bVar8 = false;
        }
        if (!bVar8) goto LAB_00112e93;
        uVar1 = ppVar6[1].type;
        ppVar6 = ppVar6 + 1;
      } while (uVar1 != 0xffff);
      iVar5 = 0;
LAB_00112e93:
      bVar8 = iVar5 == 0;
    }
LAB_00112ea0:
    if (!bVar8) {
      return in_EAX;
    }
  }
  return 0;
}

Assistant:

static int push_additional_extensions(ptls_handshake_properties_t *properties, ptls_buffer_t *sendbuf)
{
    int ret;

    if (properties != NULL && properties->additional_extensions != NULL) {
        ptls_raw_extension_t *ext;
        for (ext = properties->additional_extensions; ext->type != UINT16_MAX; ++ext) {
            buffer_push_extension(sendbuf, ext->type, { ptls_buffer_pushv(sendbuf, ext->data.base, ext->data.len); });
        }
    }
    ret = 0;
Exit:
    return ret;
}